

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void SobelXRow_C(uint8_t *src_y0,uint8_t *src_y1,uint8_t *src_y2,uint8_t *dst_sobelx,int width)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t uVar4;
  uint uVar5;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = (((uint)src_y2[uVar2] + (uint)src_y0[uVar2]) -
            ((uint)src_y2[uVar2 + 2] + (uint)src_y0[uVar2 + 2])) +
            ((uint)src_y1[uVar2] - (uint)src_y1[uVar2 + 2]) * 2;
    uVar5 = -uVar1;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    uVar4 = (uint8_t)uVar5;
    if (0xfe < uVar5) {
      uVar4 = 0xff;
    }
    dst_sobelx[uVar2] = uVar4;
  }
  return;
}

Assistant:

void SobelXRow_C(const uint8_t* src_y0,
                 const uint8_t* src_y1,
                 const uint8_t* src_y2,
                 uint8_t* dst_sobelx,
                 int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int a = src_y0[i];
    int b = src_y1[i];
    int c = src_y2[i];
    int a_sub = src_y0[i + 2];
    int b_sub = src_y1[i + 2];
    int c_sub = src_y2[i + 2];
    int a_diff = a - a_sub;
    int b_diff = b - b_sub;
    int c_diff = c - c_sub;
    int sobel = Abs(a_diff + b_diff * 2 + c_diff);
    dst_sobelx[i] = (uint8_t)(clamp255(sobel));
  }
}